

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O1

idx_t duckdb::TemplatedUpdateNumericStatistics<long>
                (UpdateSegment *segment,SegmentStatistics *stats,UnifiedVectorFormat *update,
                idx_t count,SelectionVector *sel)

{
  data_ptr_t pdVar1;
  unsigned_long *puVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  long lVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  idx_t iVar6;
  long lVar7;
  long lVar8;
  idx_t iVar9;
  idx_t iVar10;
  
  pdVar1 = update->data;
  if ((update->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      psVar3 = update->sel->sel_vector;
      lVar7 = *(long *)((long)&(stats->statistics).stats_union + 8);
      lVar8 = *(long *)((long)&(stats->statistics).stats_union + 0x18);
      iVar6 = 0;
      do {
        iVar9 = iVar6;
        if (psVar3 != (sel_t *)0x0) {
          iVar9 = (idx_t)psVar3[iVar6];
        }
        lVar5 = *(long *)(pdVar1 + iVar9 * 8);
        if (lVar5 <= lVar7) {
          lVar7 = lVar5;
        }
        if (lVar8 <= lVar5) {
          lVar8 = lVar5;
        }
        *(long *)((long)&(stats->statistics).stats_union + 8) = lVar7;
        *(long *)((long)&(stats->statistics).stats_union + 0x18) = lVar8;
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
    }
    this = (sel->selection_data).internal.
           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (sel->selection_data).internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (sel->selection_data).internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    sel->sel_vector = (sel_t *)0x0;
    iVar6 = count;
  }
  else {
    SelectionVector::Initialize(sel,0x800);
    if (count == 0) {
      iVar6 = 0;
    }
    else {
      puVar2 = (update->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      psVar3 = update->sel->sel_vector;
      psVar4 = sel->sel_vector;
      lVar7 = *(long *)((long)&(stats->statistics).stats_union + 8);
      lVar8 = *(long *)((long)&(stats->statistics).stats_union + 0x18);
      iVar9 = 0;
      iVar6 = 0;
      do {
        iVar10 = iVar9;
        if (psVar3 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar3[iVar9];
        }
        if ((puVar2 == (unsigned_long *)0x0) || ((puVar2[iVar10 >> 6] >> (iVar10 & 0x3f) & 1) != 0))
        {
          psVar4[iVar6] = (sel_t)iVar9;
          iVar6 = iVar6 + 1;
          lVar5 = *(long *)(pdVar1 + iVar10 * 8);
          if (lVar5 <= lVar7) {
            lVar7 = lVar5;
          }
          *(long *)((long)&(stats->statistics).stats_union + 8) = lVar7;
          if (lVar8 <= lVar5) {
            lVar8 = lVar5;
          }
          *(long *)((long)&(stats->statistics).stats_union + 0x18) = lVar8;
        }
        iVar9 = iVar9 + 1;
      } while (count != iVar9);
    }
  }
  return iVar6;
}

Assistant:

idx_t TemplatedUpdateNumericStatistics(UpdateSegment *segment, SegmentStatistics &stats, UnifiedVectorFormat &update,
                                       idx_t count, SelectionVector &sel) {
	auto update_data = update.GetData<T>(update);
	auto &mask = update.validity;

	if (mask.AllValid()) {
		for (idx_t i = 0; i < count; i++) {
			auto idx = update.sel->get_index(i);
			stats.statistics.UpdateNumericStats<T>(update_data[idx]);
		}
		sel.Initialize(nullptr);
		return count;
	} else {
		idx_t not_null_count = 0;
		sel.Initialize(STANDARD_VECTOR_SIZE);
		for (idx_t i = 0; i < count; i++) {
			auto idx = update.sel->get_index(i);
			if (mask.RowIsValid(idx)) {
				sel.set_index(not_null_count++, i);
				stats.statistics.UpdateNumericStats<T>(update_data[idx]);
			}
		}
		return not_null_count;
	}
}